

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O3

bool __thiscall DAGPropagator::propagate(DAGPropagator *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  _Rb_tree_color _Var1;
  _Bvector_impl *p_Var2;
  bool bVar3;
  _Rb_tree_color _Var4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  allocator_type local_5a;
  bool local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)(int)(this->super_DReachabilityPropagator).super_GraphPropagator.es.sz,
             &local_59,&local_5a);
  this_00 = &this->processed_e;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&this_00->super__Bvector_base<std::allocator<bool>_>);
  (this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  p_Var2 = &(this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var2->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var2->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  p_Var2 = &(this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var2->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var2->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._12_4_;
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)(int)(this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz,
             &local_59,&local_5a);
  this_01 = &this->processed_n;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&this_01->super__Bvector_base<std::allocator<bool>_>);
  (this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  p_Var2 = &(this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var2->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var2->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  (this_01->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  p_Var2 = &(this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var2->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var2->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._12_4_;
  bVar3 = DReachabilityPropagator::propagate(&this->super_DReachabilityPropagator);
  if (bVar3) {
    for (p_Var6 = (this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      _Var1 = p_Var6[1]._M_color;
      uVar7 = (ulong)(int)_Var1;
      _Var4 = _Var1 + 0x3f;
      if (-1 < (long)uVar7) {
        _Var4 = _Var1;
      }
      if ((((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)((int)_Var4 >> 6) +
             (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
            (uVar7 & 0x3f) & 1) == 0) &&
         (iVar5 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                    _vptr_Propagator[0x11])(this), (char)iVar5 == '\0')) goto LAB_001805af;
    }
    bVar3 = true;
    for (p_Var6 = (this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      _Var1 = p_Var6[1]._M_color;
      uVar7 = (ulong)(int)_Var1;
      _Var4 = _Var1 + 0x3f;
      if (-1 < (long)uVar7) {
        _Var4 = _Var1;
      }
      if ((((this_01->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)((int)_Var4 >> 6) +
             (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
            (uVar7 & 0x3f) & 1) == 0) &&
         (iVar5 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                    _vptr_Propagator[0x14])(this), (char)iVar5 == '\0')) goto LAB_001805af;
    }
  }
  else {
LAB_001805af:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DAGPropagator::propagate() {
	processed_e = std::vector<bool>(nbEdges(), false);
	processed_n = std::vector<bool>(nbNodes(), false);

	if (!DReachabilityPropagator::propagate()) {
		return false;
	}

	std::set<int>::iterator it;

	for (it = new_edge.begin(); it != new_edge.end(); ++it) {
		if (!processed_e[*it]) {
			if (!propagateNewEdge(*it)) {
				return false;
			}
		}
	}

	for (it = new_node.begin(); it != new_node.end(); ++it) {
		if (!processed_n[*it]) {
			if (!propagateNewNode(*it)) {
				return false;
			}
		}
	}

	return true;
}